

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_TEXM3X3SPEC_helper(Context *ctx)

{
  if (ctx->glsl_generated_texm3x3spec_helper != 0) {
    return;
  }
  ctx->glsl_generated_texm3x3spec_helper = 1;
  push_output(ctx,&ctx->helpers);
  output_line(ctx,"float3 TEXM3X3SPEC_reflection(const float3 normal, const float3 eyeray)");
  output_line(ctx,"{");
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"return (2.0 * ((normal * eyeray) / (normal * normal)) * normal) - eyeray;");
  ctx->indent = ctx->indent + -1;
  output_line(ctx,"}");
  output_blank_line(ctx);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_METAL_TEXM3X3SPEC_helper(Context *ctx)
{
    if (ctx->glsl_generated_texm3x3spec_helper)
        return;

    ctx->glsl_generated_texm3x3spec_helper = 1;

    push_output(ctx, &ctx->helpers);
    output_line(ctx, "float3 TEXM3X3SPEC_reflection(const float3 normal, const float3 eyeray)");
    output_line(ctx, "{"); ctx->indent++;
    output_line(ctx,   "return (2.0 * ((normal * eyeray) / (normal * normal)) * normal) - eyeray;"); ctx->indent--;
    output_line(ctx, "}");
    output_blank_line(ctx);
    pop_output(ctx);
}